

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shanten.cpp
# Opt level: O2

bool mahjong::is_waiting(hand_tiles_t *hand_tiles,useful_table_t *useful_table)

{
  tile_t *standing_tiles;
  bool bVar1;
  bool bVar2;
  long lVar3;
  intptr_t standing_cnt;
  useful_table_t *__src;
  useful_table_t table_special;
  useful_table_t table_basic;
  
  if (hand_tiles->tile_count == 10) {
    standing_cnt = 10;
  }
  else {
    if (hand_tiles->tile_count != 0xd) {
      bVar2 = false;
      goto LAB_00106c83;
    }
    standing_tiles = hand_tiles->standing_tiles;
    bVar1 = is_thirteen_orphans_wait(standing_tiles,0xd,&table_special);
    bVar2 = true;
    if (bVar1) goto LAB_00106c83;
    bVar1 = is_honors_and_knitted_tiles_wait(standing_tiles,0xd,&table_special);
    if (bVar1) goto LAB_00106c83;
    bVar1 = is_seven_pairs_wait(standing_tiles,0xd,&table_special);
    if (bVar1) goto LAB_00106c83;
    standing_cnt = 0xd;
  }
  bVar2 = is_knitted_straight_wait(hand_tiles->standing_tiles,standing_cnt,&table_special);
LAB_00106c83:
  bVar1 = is_basic_form_wait(hand_tiles->standing_tiles,hand_tiles->tile_count,&table_basic);
  if (useful_table != (useful_table_t *)0x0) {
    if ((bVar2 & bVar1) == 1) {
      for (lVar3 = 0; lVar3 != 0x48; lVar3 = lVar3 + 1) {
        (*useful_table)[lVar3] = (bool)(table_basic[lVar3] | table_special[lVar3]);
      }
    }
    else if ((bVar1 | bVar2) == 1) {
      __src = &table_special;
      if (bVar1) {
        __src = &table_basic;
      }
      memcpy(useful_table,__src,0x48);
    }
  }
  return (bool)(bVar2 | bVar1);
}

Assistant:

bool is_waiting(const hand_tiles_t &hand_tiles, useful_table_t *useful_table) {
    bool spcial_waiting = false, basic_waiting = false;
    useful_table_t table_special, table_basic;

    if (hand_tiles.tile_count == 13) {
        if (is_thirteen_orphans_wait(hand_tiles.standing_tiles, 13, &table_special)) {
            spcial_waiting = true;
        }
        else if (is_honors_and_knitted_tiles_wait(hand_tiles.standing_tiles, 13, &table_special)) {
            spcial_waiting = true;
        }
        else if (is_seven_pairs_wait(hand_tiles.standing_tiles, 13, &table_special)) {
            spcial_waiting = true;
        }
        else if (is_knitted_straight_wait(hand_tiles.standing_tiles, 13, &table_special)) {
            spcial_waiting = true;
        }
    }
    else if (hand_tiles.tile_count == 10) {
        if (is_knitted_straight_wait(hand_tiles.standing_tiles, 10, &table_special)) {
            spcial_waiting = true;
        }
    }

    if (is_basic_form_wait(hand_tiles.standing_tiles, hand_tiles.tile_count, &table_basic)) {
        basic_waiting = true;
    }

    if (useful_table != nullptr) {
        if (spcial_waiting && basic_waiting) {
            std::transform(std::begin(table_special), std::end(table_special), std::begin(table_basic), std::begin(*useful_table),
                [](bool a, bool b) { return a || b; });
        }
        else if (basic_waiting) {
            memcpy(*useful_table, table_basic, sizeof(table_basic));
        }
        else if (spcial_waiting) {
            memcpy(*useful_table, table_special, sizeof(table_special));
        }
    }

    return (spcial_waiting || basic_waiting);
}